

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev3dev.cpp
# Opt level: O0

void ev3dev::sound::tone(vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                         *sequence,bool bSynchronous)

{
  bool bVar1;
  size_type sVar2;
  ostream *this;
  reference pvVar3;
  vector<float,_std::allocator<float>_> v;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  *__range1;
  bool first;
  ostringstream args;
  ostream *in_stack_fffffffffffffdf8;
  ostream *in_stack_fffffffffffffe00;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffe10;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffe48;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffe50;
  __normal_iterator<const_std::vector<float,_std::allocator<float>_>_*,_std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>
  local_1a0 [2];
  byte local_189;
  ostringstream local_188 [311];
  undefined1 in_stack_ffffffffffffffaf;
  string *in_stack_ffffffffffffffb0;
  
  std::__cxx11::ostringstream::ostringstream(local_188);
  local_189 = 1;
  local_1a0[0]._M_current =
       (vector<float,_std::allocator<float>_> *)
       std::
       vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
       ::begin((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                *)in_stack_fffffffffffffdf8);
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::end((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
         *)in_stack_fffffffffffffdf8);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_std::vector<float,_std::allocator<float>_>_*,_std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>
                             *)in_stack_fffffffffffffe00,
                            (__normal_iterator<const_std::vector<float,_std::allocator<float>_>_*,_std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>
                             *)in_stack_fffffffffffffdf8), bVar1) {
    __gnu_cxx::
    __normal_iterator<const_std::vector<float,_std::allocator<float>_>_*,_std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>
    ::operator*(local_1a0);
    std::vector<float,_std::allocator<float>_>::vector
              (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
    if ((local_189 & 1) == 0) {
      std::operator<<((ostream *)local_188," -n");
    }
    else {
      local_189 = 0;
    }
    sVar2 = std::vector<float,_std::allocator<float>_>::size
                      ((vector<float,_std::allocator<float>_> *)&stack0xfffffffffffffe40);
    if (sVar2 != 0) {
      this = std::operator<<((ostream *)local_188," -f ");
      pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)&stack0xfffffffffffffe40,0);
      std::ostream::operator<<(this,*pvVar3);
      sVar2 = std::vector<float,_std::allocator<float>_>::size
                        ((vector<float,_std::allocator<float>_> *)&stack0xfffffffffffffe40);
      if (1 < sVar2) {
        in_stack_fffffffffffffe00 = std::operator<<((ostream *)local_188," -l ");
        pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                           ((vector<float,_std::allocator<float>_> *)&stack0xfffffffffffffe40,1);
        std::ostream::operator<<(in_stack_fffffffffffffe00,*pvVar3);
        sVar2 = std::vector<float,_std::allocator<float>_>::size
                          ((vector<float,_std::allocator<float>_> *)&stack0xfffffffffffffe40);
        if (2 < sVar2) {
          in_stack_fffffffffffffdf8 = std::operator<<((ostream *)local_188," -D ");
          pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                             ((vector<float,_std::allocator<float>_> *)&stack0xfffffffffffffe40,2);
          std::ostream::operator<<(in_stack_fffffffffffffdf8,*pvVar3);
        }
      }
    }
    std::vector<float,_std::allocator<float>_>::~vector(in_stack_fffffffffffffe10);
    __gnu_cxx::
    __normal_iterator<const_std::vector<float,_std::allocator<float>_>_*,_std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>
    ::operator++(local_1a0);
  }
  std::__cxx11::ostringstream::str();
  beep(in_stack_ffffffffffffffb0,(bool)in_stack_ffffffffffffffaf);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffe10);
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return;
}

Assistant:

void sound::tone(
        const std::vector< std::vector<float> > &sequence,
        bool bSynchronous
        )
{
    std::ostringstream args;
    bool first = true;

    for(auto v : sequence) {
        if (first) {
            first = false;
        } else {
            args << " -n";
        }

        if (v.size() > 0) {
            args << " -f " << v[0];
        } else {
            continue;
        }

        if (v.size() > 1) {
            args << " -l " << v[1];
        } else {
            continue;
        }

        if (v.size() > 2) {
            args << " -D " << v[2];
        } else {
            continue;
        }
    }

    beep(args.str(), bSynchronous);
}